

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O2

StatementBlockSymbol *
slang::ast::StatementBlockSymbol::fromSyntax(Scope *scope,ConditionalStatementSyntax *syntax)

{
  SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> *pSVar1;
  SyntaxKind SVar2;
  Compilation *args;
  ConditionalPredicateSyntax *pCVar3;
  size_t sVar4;
  BlockStatementSyntax *syntax_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  ConditionalStatementSyntax *pCVar5;
  StatementBlockSymbol *pSVar6;
  ConditionalPatternSyntax *pCVar7;
  StatementBlockSymbol *pSVar8;
  SourceLocation SVar9;
  StatementBlockSymbol *pSVar10;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> sVar11;
  iterator __begin2;
  VariableLifetime local_8c;
  StatementBlockSymbol *local_88;
  VariableLifetime local_7c;
  Scope *local_78;
  SourceLocation local_70;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  ConditionalStatementSyntax *local_58;
  Token local_50;
  Token local_40;
  
  args = scope->compilation;
  pCVar3 = (syntax->predicate).ptr;
  pSVar1 = &pCVar3->conditions;
  local_68._M_str = (char *)0x0;
  sVar4 = (pCVar3->conditions).elements._M_extent._M_extent_value;
  local_88 = (StatementBlockSymbol *)0x0;
  pSVar10 = (StatementBlockSymbol *)0x0;
  local_78 = scope;
  local_68._M_len = (size_t)pSVar1;
  local_58 = syntax;
  for (; (pCVar5 = local_58,
         (SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> *)local_68._M_len != pSVar1
         || (local_68._M_str != (char *)(sVar4 + 1 >> 1))); local_68._M_str = local_68._M_str + 1) {
    pCVar7 = slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::
             iterator_base<slang::syntax::ConditionalPatternSyntax_*>::dereference
                       ((iterator_base<slang::syntax::ConditionalPatternSyntax_*> *)&local_68);
    pSVar8 = pSVar10;
    pSVar6 = local_88;
    if (pCVar7->matchesClause != (MatchesClauseSyntax *)0x0) {
      local_40 = (Token)(ZEXT816(0x489e8d) << 0x40);
      local_50 = slang::syntax::SyntaxNode::getFirstToken(&pCVar7->matchesClause->super_SyntaxNode);
      local_70 = parsing::Token::location(&local_50);
      local_8c = Automatic;
      local_7c = Automatic;
      pSVar8 = BumpAllocator::
               emplace<slang::ast::StatementBlockSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::StatementBlockKind,slang::ast::VariableLifetime>
                         (&args->super_BumpAllocator,args,
                          (basic_string_view<char,_std::char_traits<char>_> *)&local_40,&local_70,
                          &local_8c,&local_7c);
      Scope::getOrAddDeferredData(&pSVar8->super_Scope);
      (pSVar8->super_Symbol).originatingSyntax = &pCVar7->super_SyntaxNode;
      pSVar6 = pSVar8;
      if (local_88 != (StatementBlockSymbol *)0x0) {
        Scope::addMember(&pSVar10->super_Scope,&pSVar8->super_Symbol);
        pSVar6 = local_88;
      }
    }
    local_88 = pSVar6;
    pSVar10 = pSVar8;
  }
  syntax_00 = (BlockStatementSyntax *)(local_58->statement).ptr;
  SVar2 = (syntax_00->super_StatementSyntax).super_SyntaxNode.kind;
  if ((SVar2 == ParallelBlockStatement) || (SVar2 == SequentialBlockStatement)) {
    pSVar8 = fromSyntax(local_78,syntax_00);
  }
  else {
    local_68._M_len = 0;
    local_68._M_str = "";
    local_40 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)syntax_00);
    SVar9 = parsing::Token::location(&local_40);
    local_50._0_8_ = SVar9;
    local_70 = (SourceLocation)((ulong)local_70 & 0xffffffff00000000);
    local_8c = Automatic;
    pSVar8 = BumpAllocator::
             emplace<slang::ast::StatementBlockSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::StatementBlockKind,slang::ast::VariableLifetime>
                       (&args->super_BumpAllocator,args,&local_68,(SourceLocation *)&local_50,
                        (StatementBlockKind *)&local_70,&local_8c);
    (pSVar8->super_Symbol).originatingSyntax = &((pCVar5->statement).ptr)->super_SyntaxNode;
    syntax_01._M_ptr =
         (pCVar5->super_StatementSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    syntax_01._M_extent._M_extent_value =
         (pCVar5->super_StatementSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
         _M_extent_value;
    Symbol::setAttributes(&pSVar8->super_Symbol,local_78,syntax_01);
    sVar11 = Statement::createAndAddBlockItems(&pSVar8->super_Scope,(pCVar5->statement).ptr,false);
    pSVar8->blocks = sVar11;
  }
  Scope::addMember(&pSVar10->super_Scope,&pSVar8->super_Symbol);
  return local_88;
}

Assistant:

StatementBlockSymbol& StatementBlockSymbol::fromSyntax(const Scope& scope,
                                                       const ConditionalStatementSyntax& syntax) {
    // Each matches clause gets its own block with its own variables.
    auto& comp = scope.getCompilation();
    StatementBlockSymbol* first = nullptr;
    StatementBlockSymbol* curr = nullptr;

    for (auto cond : syntax.predicate->conditions) {
        if (cond->matchesClause) {
            auto block = comp.emplace<StatementBlockSymbol>(
                comp, ""sv, cond->matchesClause->getFirstToken().location(),
                StatementBlockKind::Sequential, VariableLifetime::Automatic);

            // Each block needs elaboration to collect pattern variables.
            block->setNeedElaboration();
            block->setSyntax(*cond);

            if (!first) {
                first = curr = block;
            }
            else {
                curr->addMember(*block);
                curr = block;
            }
        }
    }

    // The most nested block gets the actual statement items. If it's already a sequential
    // block we can just use that, otherwise we need to fabricate one.
    StatementBlockSymbol* block;
    if (syntax.statement->kind == SyntaxKind::SequentialBlockStatement ||
        syntax.statement->kind == SyntaxKind::ParallelBlockStatement) {

        block = &StatementBlockSymbol::fromSyntax(scope,
                                                  syntax.statement->as<BlockStatementSyntax>());
    }
    else {
        block = comp.emplace<StatementBlockSymbol>(comp, ""sv,
                                                   syntax.statement->getFirstToken().location(),
                                                   StatementBlockKind::Sequential,
                                                   VariableLifetime::Automatic);
        block->setSyntax(*syntax.statement);
        block->setAttributes(scope, syntax.attributes);
        block->blocks = Statement::createAndAddBlockItems(*block, *syntax.statement,
                                                          /* labelHandled */ false);
    }

    SLANG_ASSERT(curr && first);
    curr->addMember(*block);

    return *first;
}